

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUnary(Parser *this)

{
  Token *this_00;
  Lexer *lexer;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  Lexer *this_01;
  undefined8 uVar4;
  long *in_RSI;
  pointer __p;
  TokenType type;
  TokenType local_52;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_50;
  Position local_48;
  __uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> local_30;
  
  this_00 = *(Token **)(*in_RSI + 0xb8);
  bVar1 = Token::operator==(this_00,TOK_OP_BRACKET_OPEN);
  if (bVar1) {
    parseBrackets(this);
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  bVar1 = Token::operator==(this_00,TOK_OP_ARR_BRACKET_OPEN);
  if (bVar1) {
    parseArray(this);
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  local_52 = this_00->type;
  local_48.line._0_2_ = local_52;
  cVar2 = std::
          _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)OPERATORS_INFO,(key_type *)&local_48);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    if (*(int *)((long)cVar2.
                       super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                       ._M_cur + 0x10) == 1) {
      local_48.line._0_2_ = this_00->type;
      cVar3 = std::
              _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)TOKEN_BIOP_TO_UNOP,(key_type *)&local_48);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
          _M_cur == (__node_type *)0x0) goto LAB_0010d29a;
      local_52 = *(TokenType *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                         ._M_cur + 10);
    }
    do {
      Lexer::next((Lexer *)*in_RSI);
      bVar1 = Token::operator==(*(Token **)(*in_RSI + 0xb8),TOK_EOL);
    } while (bVar1);
    cVar2 = std::
            _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)OPERATORS_INFO,&local_52);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      parseExpression((Parser *)&local_50,(Precedence)in_RSI);
      if ((Lexer *)local_50._M_head_impl != (Lexer *)0x0) {
        lexer = (Lexer *)*in_RSI;
        Position::operator+(&this_00->pos,&(local_50._M_head_impl)->pos);
        this_01 = (Lexer *)operator_new(0x48);
        UnOpExpr::UnOpExpr((UnOpExpr *)this_01,lexer,&local_48,this_00,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           &local_50);
        local_30._M_t.
        super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
        super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
             (tuple<pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>)
             (_Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>)0x0;
        this->lexer = this_01;
        std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                   &local_30);
        if ((Lexer *)local_50._M_head_impl == (Lexer *)0x0) {
          return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 this;
        }
        (*(local_50._M_head_impl)->_vptr_Expr[1])();
        return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
               (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
      }
LAB_0010d29a:
      this->lexer = (Lexer *)0x0;
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
  }
  uVar4 = std::__throw_out_of_range("_Map_base::at");
  __clang_call_terminate(uVar4);
}

Assistant:

std::unique_ptr<Expr> Parser::parseUnary() noexcept {
  const Token *tok = lexer.getCurrentToken();
  if (*tok == TokenType::TOK_OP_BRACKET_OPEN)
    return parseBrackets();
  else if (*tok == TokenType::TOK_OP_ARR_BRACKET_OPEN)
    return parseArray();

  
  TokenType type = tok->getType();
  if (std::get<1>(OPERATORS_INFO.at(tok->getType())) == OperatorType::BINARY) {
    auto bioptounop = TOKEN_BIOP_TO_UNOP.find(tok->getType());
    if (bioptounop == TOKEN_BIOP_TO_UNOP.end())
      return nullptr;

    type = std::get<1>(*bioptounop);
  }

  lexer.next(); // eat unary operator
  // ignore newline tekons
  while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
    lexer.next();

  const Precedence prec = std::get<0>(OPERATORS_INFO.at(type));
  std::unique_ptr<Expr> expr = parseExpression(prec);
  if (!expr)
    return nullptr;

  return std::make_unique<UnOpExpr>(lexer,
    tok->getPosition() + expr->getPosition(), tok, std::move(expr));
}